

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O0

bool __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::get_entry
          (dynamic_section_accessor_template<ELFIO::section> *this,Elf_Xword index,Elf_Xword *tag,
          Elf_Xword *value,string *str)

{
  elfio *this_00;
  uchar uVar1;
  Elf_Half EVar2;
  Elf_Xword EVar3;
  section *section;
  char *pcVar4;
  char *result;
  string_section_accessor strsec;
  string *str_local;
  Elf_Xword *value_local;
  Elf_Xword *tag_local;
  Elf_Xword index_local;
  dynamic_section_accessor_template<ELFIO::section> *this_local;
  
  strsec.string_section = (section *)str;
  EVar3 = get_entries_num(this);
  if (index < EVar3) {
    uVar1 = elfio::get_class(this->elf_file);
    if (uVar1 == '\x01') {
      generic_get_entry_dyn<ELFIO::Elf32_Dyn>(this,index,tag,value);
    }
    else {
      generic_get_entry_dyn<ELFIO::Elf64_Dyn>(this,index,tag,value);
    }
    if ((((*tag == 1) || (*tag == 0xe)) || (*tag == 0xf)) || (*tag == 0x1d)) {
      this_00 = this->elf_file;
      EVar2 = get_string_table_index(this);
      section = elfio::Sections::operator[](&this_00->sections,(uint)EVar2);
      string_section_accessor_template<ELFIO::section>::string_section_accessor_template
                ((string_section_accessor_template<ELFIO::section> *)&result,section);
      pcVar4 = string_section_accessor_template<ELFIO::section>::get_string
                         ((string_section_accessor_template<ELFIO::section> *)&result,
                          (Elf_Word)*value);
      if (pcVar4 == (char *)0x0) {
        std::__cxx11::string::clear();
        return false;
      }
      std::__cxx11::string::operator=((string *)strsec.string_section,pcVar4);
    }
    else {
      std::__cxx11::string::clear();
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool get_entry( Elf_Xword    index,
                    Elf_Xword&   tag,
                    Elf_Xword&   value,
                    std::string& str ) const
    {
        if ( index >= get_entries_num() ) { // Is index valid
            return false;
        }

        if ( elf_file.get_class() == ELFCLASS32 ) {
            generic_get_entry_dyn<Elf32_Dyn>( index, tag, value );
        }
        else {
            generic_get_entry_dyn<Elf64_Dyn>( index, tag, value );
        }

        // If the tag has a string table reference - prepare the string
        if ( tag == DT_NEEDED || tag == DT_SONAME || tag == DT_RPATH ||
             tag == DT_RUNPATH ) {
            string_section_accessor strsec(
                elf_file.sections[get_string_table_index()] );
            const char* result = strsec.get_string( (Elf_Word)value );
            if ( nullptr == result ) {
                str.clear();
                return false;
            }
            str = result;
        }
        else {
            str.clear();
        }

        return true;
    }